

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O0

void __thiscall
cmDocumentationFormatter::PrintColumn(cmDocumentationFormatter *this,ostream *os,char *text)

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  char *local_68;
  char *local_40;
  char *r;
  int width;
  bool firstLine;
  bool newSentence;
  long column;
  char *l;
  char *text_local;
  ostream *os_local;
  cmDocumentationFormatter *this_local;
  
  _width = (char *)0x0;
  bVar5 = false;
  bVar2 = true;
  iVar1 = this->TextWidth;
  sVar3 = strlen(this->TextIndent);
  column = (long)text;
  while (*(char *)column != '\0') {
    local_40 = (char *)column;
    while( true ) {
      bVar4 = false;
      if ((*local_40 != '\0') && (bVar4 = false, *local_40 != '\n')) {
        bVar4 = *local_40 != ' ';
      }
      if (!bVar4) break;
      local_40 = local_40 + 1;
    }
    if ((long)local_40 - column <
        ((long)(iVar1 - (int)sVar3) - (long)_width) - (long)(int)(uint)bVar5) {
      if ((ulong)column < local_40) {
        if (_width == (char *)0x0) {
          if (bVar2) {
            local_68 = "";
          }
          else {
            local_68 = this->TextIndent;
          }
          std::operator<<(os,local_68);
        }
        else if (bVar5) {
          std::operator<<(os,"  ");
          _width = _width + 2;
        }
        else {
          std::operator<<(os," ");
          _width = _width + 1;
        }
        std::ostream::write((char *)os,column);
        bVar5 = local_40[-1] == '.';
      }
      if (*local_40 == '\n') {
        std::operator<<(os,"\n");
        local_40 = local_40 + 1;
        _width = (char *)0x0;
        bVar2 = false;
      }
      else {
        _width = local_40 + ((long)_width - column);
      }
    }
    else {
      std::operator<<(os,"\n");
      bVar2 = false;
      if ((ulong)column < local_40) {
        std::operator<<(os,this->TextIndent);
        std::ostream::write((char *)os,column);
        _width = local_40 + -column;
        bVar5 = local_40[-1] == '.';
      }
      else {
        _width = (char *)0x0;
      }
    }
    for (column = (long)local_40; *(char *)column == ' '; column = column + 1) {
    }
  }
  return;
}

Assistant:

void cmDocumentationFormatter::PrintColumn(std::ostream& os, const char* text)
{
  // Print text arranged in an indented column of fixed width.
  const char* l = text;
  long column = 0;
  bool newSentence = false;
  bool firstLine = true;
  int width = this->TextWidth - static_cast<int>(strlen(this->TextIndent));

  // Loop until the end of the text.
  while (*l) {
    // Parse the next word.
    const char* r = l;
    while (*r && (*r != '\n') && (*r != ' ')) {
      ++r;
    }

    // Does it fit on this line?
    if (r - l < (width - column - (newSentence ? 1 : 0))) {
      // Word fits on this line.
      if (r > l) {
        if (column) {
          // Not first word on line.  Separate from the previous word
          // by a space, or two if this is a new sentence.
          if (newSentence) {
            os << "  ";
            column += 2;
          } else {
            os << " ";
            column += 1;
          }
        } else {
          // First word on line.  Print indentation unless this is the
          // first line.
          os << (firstLine ? "" : this->TextIndent);
        }

        // Print the word.
        os.write(l, static_cast<long>(r - l));
        newSentence = (*(r - 1) == '.');
      }

      if (*r == '\n') {
        // Text provided a newline.  Start a new line.
        os << "\n";
        ++r;
        column = 0;
        firstLine = false;
      } else {
        // No provided newline.  Continue this line.
        column += static_cast<long>(r - l);
      }
    } else {
      // Word does not fit on this line.  Start a new line.
      os << "\n";
      firstLine = false;
      if (r > l) {
        os << this->TextIndent;
        os.write(l, static_cast<long>(r - l));
        column = static_cast<long>(r - l);
        newSentence = (*(r - 1) == '.');
      } else {
        column = 0;
      }
    }

    // Move to beginning of next word.  Skip over whitespace.
    l = r;
    while (*l == ' ') {
      ++l;
    }
  }
}